

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O3

ImageFeatureType * __thiscall
CoreML::Specification::FeatureType::mutable_imagetype(FeatureType *this)

{
  ulong uVar1;
  ImageFeatureType *pIVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 4) {
    pIVar2 = (ImageFeatureType *)(this->Type_).int64type_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 4;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pIVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ImageFeatureType>
                       (arena);
    (this->Type_).imagetype_ = pIVar2;
  }
  return pIVar2;
}

Assistant:

inline ::CoreML::Specification::ImageFeatureType* FeatureType::mutable_imagetype() {
  ::CoreML::Specification::ImageFeatureType* _msg = _internal_mutable_imagetype();
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.FeatureType.imageType)
  return _msg;
}